

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O3

int __thiscall GoState<9U,_9U>::get_player_score(GoState<9U,_9U> *this,int player)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int j;
  ulong uVar4;
  uchar (*pauVar5) [9];
  int i;
  ulong uVar6;
  
  pauVar5 = this->board;
  uVar6 = 0;
  iVar3 = 0;
  do {
    uVar4 = 0;
    do {
      bVar1 = (*pauVar5)[uVar4];
      if (bVar1 == 0) {
        uVar2 = (*this->_vptr_GoState[7])(this,uVar6 & 0xffffffff,uVar4 & 0xffffffff,player);
        iVar3 = iVar3 + (uVar2 & 0xff);
        bVar1 = (*pauVar5)[uVar4];
      }
      iVar3 = (uint)((uint)bVar1 == player) + iVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 9);
    uVar6 = uVar6 + 1;
    pauVar5 = pauVar5 + 1;
  } while (uVar6 != 9);
  return iVar3;
}

Assistant:

virtual int get_player_score(int player) const
	{
		int score = 0;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == empty) {
				if (is_eye(i, j, player)) {
					score++;
				}
			}
			if (board[i][j] == player) {
				score++;
			}
		}}
		return score;
	}